

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O0

void t4(void)

{
  ssize_t sVar1;
  char p [32];
  gpioReport_t r;
  int toggle_ok;
  int seq_ok;
  int l;
  int b;
  int s;
  int n;
  int f;
  int e;
  int h;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  ushort local_30 [4];
  uint local_28;
  undefined4 local_24;
  undefined4 local_20;
  uint local_1c;
  int local_18;
  uint local_14;
  int local_10;
  int local_c;
  undefined4 local_8;
  uint local_4;
  
  printf("Pipe notification tests.\n");
  gpioSetPWMfrequency(0x19,0);
  gpioPWM(0x19,0);
  gpioSetPWMrange(0x19,100);
  local_4 = gpioNotifyOpen();
  sprintf(&stack0xffffffffffffffa8,"/dev/pigpio%d",(ulong)local_4);
  local_c = open(&stack0xffffffffffffffa8,0);
  local_8 = gpioNotifyBegin(local_4,0x2000000);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  gpioPWM(0x19,0x32);
  time_sleep(0x4010000000000000);
  gpioPWM(0x19,0);
  local_8 = gpioNotifyPause(local_4);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  local_8 = gpioNotifyClose(local_4);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  local_10 = 0;
  local_14 = 0;
  local_1c = 0;
  local_20 = 1;
  local_24 = 1;
  while( true ) {
    sVar1 = read(local_c,local_30,0xc);
    local_18 = (int)sVar1;
    if (local_18 != 0xc) break;
    if (local_14 != local_30[0]) {
      local_20 = 0;
    }
    if ((local_10 != 0) && (local_1c != (local_28 & 0x2000000))) {
      local_24 = 0;
    }
    if ((local_28 & 0x2000000) == 0) {
      local_1c = 0x2000000;
    }
    else {
      local_1c = 0;
    }
    local_14 = local_14 + 1;
    local_10 = local_10 + 1;
    local_18 = 0xc;
  }
  close(local_c);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void t4()
{
   int h, e, f, n, s, b, l, seq_ok, toggle_ok;
   gpioReport_t r;
   char p[32];

   printf("Pipe notification tests.\n");

   gpioSetPWMfrequency(GPIO, 0);
   gpioPWM(GPIO, 0);
   gpioSetPWMrange(GPIO, 100);

   h = gpioNotifyOpen();

   sprintf(p, "/dev/pigpio%d", h);
   f = open(p, O_RDONLY);

   e = gpioNotifyBegin(h, (1<<GPIO));
   CHECK(4, 1, e, 0, 0, "notify open/begin");

   gpioPWM(GPIO, 50);
   time_sleep(4);
   gpioPWM(GPIO, 0);

   e = gpioNotifyPause(h);
   CHECK(4, 2, e, 0, 0, "notify pause");

   e = gpioNotifyClose(h);
   CHECK(4, 3, e, 0, 0, "notify close");

   n = 0;
   s = 0;
   l = 0;
   seq_ok = 1;
   toggle_ok = 1;

   while (1)
   {
      b = read(f, &r, 12);
      if (b == 12)
      {
         if (s != r.seqno) seq_ok = 0;

         if (n) if (l != (r.level&(1<<GPIO))) toggle_ok = 0;

         if (r.level&(1<<GPIO)) l = 0;
         else                   l = (1<<GPIO);
           
         s++;
         n++;

         // printf("%d %d %d %X\n", r.seqno, r.flags, r.tick, r.level);
      }
      else break;
   }

   close(f);

   CHECK(4, 4, seq_ok, 1, 0, "sequence numbers ok");

   CHECK(4, 5, toggle_ok, 1, 0, "gpio toggled ok");

   CHECK(4, 6, n, 80, 10, "number of notifications");
}